

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O3

int os_interface_linux_address_set(os_interface_ip_change *addr)

{
  _Bool _Var1;
  uint uVar2;
  list_entity **pplVar3;
  byte bVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  netaddr_str nbuf;
  uint8_t buffer [1024];
  
  memset(buffer,0,0x400);
  _Var1 = addr->set;
  buffer[6] = '\x05';
  buffer[7] = '\0';
  if (_Var1 != false) {
    buffer[6] = '\x05';
    buffer[7] = '\x05';
  }
  buffer._4_2_ = _Var1 ^ 0x15;
  buffer[0] = '\x18';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  uVar9 = (ulong)_oonf_os_interface_subsystem.logging;
  if (((&log_global_mask)[uVar9] & 1) != 0) {
    pcVar10 = "re";
    if (_Var1 != false) {
      pcVar10 = "";
    }
    uVar2 = addr->if_index;
    uVar8 = netaddr_to_prefixstring(&nbuf,&addr->address,0);
    oonf_log(1,uVar9,"src/base/os_linux/os_interface_linux.c",0x1d2,0,0,"%sset address on if %d: %s"
             ,pcVar10,uVar2,uVar8);
  }
  buffer[0x10] = (addr->address)._type;
  buffer[0x11] = (addr->address)._prefix_len;
  buffer._20_4_ = addr->if_index;
  buffer[0x13] = (uint8_t)addr->scope;
  bVar4 = netaddr_get_af_maxprefix();
  iVar5 = os_system_linux_netlink_addreq(&_rtnetlink_receiver,buffer,2,&addr->address,bVar4 >> 3);
  iVar7 = -1;
  if (iVar5 == 0) {
    uVar6 = os_system_linux_netlink_send(&_rtnetlink_receiver,buffer);
    iVar7 = 0;
    if (addr->cb_finished != (_func_void_os_interface_ip_change_ptr_int *)0x0) {
      (addr->_internal)._node.next = &_rtnetlink_feedback;
      (addr->_internal)._node.prev = _rtnetlink_feedback.prev;
      pplVar3 = &(_rtnetlink_feedback.prev)->next;
      _rtnetlink_feedback.prev = (list_entity *)addr;
      *pplVar3 = (list_entity *)addr;
      (addr->_internal).nl_seq = uVar6;
    }
  }
  return iVar7;
}

Assistant:

int
os_interface_linux_address_set(struct os_interface_ip_change *addr) {
  uint8_t buffer[UIO_MAXIOV];
  struct nlmsghdr *msg;
  struct ifaddrmsg *ifaddrreq;
  int seq;
#if defined(OONF_LOG_DEBUG_INFO)
  struct netaddr_str nbuf;
#endif

  memset(buffer, 0, sizeof(buffer));

  /* get pointers for netlink message */
  msg = (void *)&buffer[0];

  if (addr->set) {
    msg->nlmsg_flags = NLM_F_REQUEST | NLM_F_CREATE | NLM_F_REPLACE | NLM_F_ACK;
    msg->nlmsg_type = RTM_NEWADDR;
  }
  else {
    msg->nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
    msg->nlmsg_type = RTM_DELADDR;
  }

  /* set length of netlink message with ifaddrmsg payload */
  msg->nlmsg_len = NLMSG_LENGTH(sizeof(struct ifaddrmsg));

  OONF_DEBUG(LOG_OS_INTERFACE, "%sset address on if %d: %s", addr->set ? "" : "re", addr->if_index,
    netaddr_to_string(&nbuf, &addr->address));

  ifaddrreq = NLMSG_DATA(msg);
  ifaddrreq->ifa_family = netaddr_get_address_family(&addr->address);
  ifaddrreq->ifa_prefixlen = netaddr_get_prefix_length(&addr->address);
  ifaddrreq->ifa_index = addr->if_index;
  ifaddrreq->ifa_scope = addr->scope;

  if (os_system_linux_netlink_addnetaddr(&_rtnetlink_receiver, msg, IFA_LOCAL, &addr->address)) {
    return -1;
  }

  /* cannot fail */
  seq = os_system_linux_netlink_send(&_rtnetlink_receiver, msg);

  if (addr->cb_finished) {
    list_add_tail(&_rtnetlink_feedback, &addr->_internal._node);
    addr->_internal.nl_seq = seq;
  }
  return 0;
}